

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

CRef __thiscall Glucose::Solver::propagate(Solver *this)

{
  ulong *puVar1;
  CRef CVar2;
  uint uVar3;
  lbool *plVar4;
  uint *puVar5;
  Watcher WVar6;
  byte bVar7;
  Watcher WVar8;
  int iVar9;
  long lVar10;
  Watcher *pWVar11;
  VarData VVar12;
  uint uVar13;
  ulong uVar14;
  Lit p;
  long lVar15;
  int iVar16;
  ulong uVar17;
  VarData VVar18;
  ulong uVar19;
  byte bVar20;
  vec<Glucose::Solver::Watcher> *pvVar21;
  Watcher *pWVar22;
  Watcher *pWVar23;
  Watcher *pWVar24;
  vec<Glucose::Solver::Watcher> *pvVar25;
  int iVar26;
  Watcher w;
  uint local_7c;
  Watcher local_70;
  int local_64;
  Solver *local_60;
  Watcher *local_58;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *local_50;
  vec<Glucose::Solver::Watcher> *local_48;
  long local_40;
  ulong local_38;
  
  local_50 = &this->watches;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(local_50);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  iVar9 = this->qhead;
  uVar17 = 0;
  if (iVar9 < (this->trail).sz) {
    local_7c = 0xffffffff;
    local_60 = this;
    do {
      this->qhead = iVar9 + 1;
      pvVar21 = (this->watchesBin).occs.data;
      p.x = (this->trail).data[iVar9].x;
      lVar15 = (long)p.x;
      pvVar25 = (this->watches).occs.data + lVar15;
      iVar9 = pvVar21[lVar15].sz;
      if (0 < iVar9) {
        pvVar21 = pvVar21 + lVar15;
        lVar10 = 0;
        do {
          pWVar11 = pvVar21->data;
          iVar26 = pWVar11[lVar10].blocker.x;
          iVar16 = iVar26 >> 1;
          plVar4 = (this->assigns).data;
          bVar7 = plVar4[iVar16].value;
          bVar20 = (byte)iVar26 & 1;
          if ((bVar7 ^ bVar20) == 1) {
            return pWVar11[lVar10].cref;
          }
          if ((bVar7 & 2) != 0) {
            CVar2 = pWVar11[lVar10].cref;
            plVar4[iVar16].value = bVar20;
            VVar18.level = (this->trail_lim).sz;
            VVar18.reason = CVar2;
            (this->vardata).data[iVar16] = VVar18;
            iVar9 = (this->trail).sz;
            (this->trail).sz = iVar9 + 1;
            (this->trail).data[iVar9].x = iVar26;
            iVar9 = pvVar21->sz;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar9);
      }
      pWVar11 = pvVar25->data;
      pWVar24 = pWVar11;
      if ((long)pvVar25->sz != 0) {
        local_58 = pWVar11 + pvVar25->sz;
        uVar13 = p.x ^ 1;
        pWVar22 = pWVar11;
        pWVar11 = local_58;
        local_48 = pvVar25;
        local_40 = lVar15;
        local_38 = uVar17;
        do {
          uVar3 = (pWVar22->blocker).x;
          plVar4 = (this->assigns).data;
          if (plVar4[(int)uVar3 >> 1].value == ((byte)uVar3 & 1)) {
            WVar8 = *pWVar22;
LAB_0010bac6:
            pWVar23 = pWVar22 + 1;
            *pWVar24 = WVar8;
            pWVar24 = pWVar24 + 1;
          }
          else {
            local_70.cref = pWVar22->cref;
            puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            puVar1 = (ulong *)(puVar5 + local_70.cref);
            local_70.blocker.x = *(uint *)((long)puVar1 + 0xc);
            if (local_70.blocker.x == uVar13) {
              local_70.blocker.x = (int)puVar1[2];
              *(int *)((long)puVar1 + 0xc) = local_70.blocker.x;
              *(uint *)(puVar1 + 2) = uVar13;
            }
            pWVar23 = pWVar22 + 1;
            iVar9 = local_70.blocker.x >> 1;
            if ((local_70.blocker.x != uVar3) &&
               (plVar4[iVar9].value == ((byte)local_70.blocker.x & 1))) {
              WVar8.blocker.x = local_70.blocker.x;
              WVar8.cref = local_70.cref;
              goto LAB_0010bac6;
            }
            uVar17 = *puVar1 >> 0x20;
            iVar26 = (int)(*puVar1 >> 0x20);
            if (this->incremental == 0) {
              if (2 < iVar26) {
                lVar15 = 0;
                do {
                  uVar3 = puVar5[(ulong)local_70.cref + lVar15 + 5];
                  if (((byte)uVar3 & 1 ^ plVar4[(int)uVar3 >> 1].value) != 1) {
                    puVar5[(ulong)local_70.cref + 4] = uVar3;
                    *(uint *)((long)puVar1 + lVar15 * 4 + 0x14) = uVar13;
                    uVar3 = puVar5[(ulong)local_70.cref + 4];
                    goto LAB_0010bcf7;
                  }
                  lVar15 = lVar15 + 1;
                } while (uVar17 - 2 != lVar15);
              }
LAB_0010bc10:
              WVar6.blocker.x = local_70.blocker.x;
              WVar6.cref = local_70.cref;
              *pWVar24 = WVar6;
              pWVar24 = pWVar24 + 1;
              plVar4 = (this->assigns).data;
              bVar7 = (byte)local_70.blocker.x & 1;
              if ((plVar4[iVar9].value ^ bVar7) == 1) {
                this->qhead = (this->trail).sz;
                for (; local_7c = local_70.cref, pWVar23 < pWVar11; pWVar23 = pWVar23 + 1) {
                  *pWVar24 = *pWVar23;
                  pWVar24 = pWVar24 + 1;
                }
              }
              else {
                plVar4[iVar9].value = bVar7;
                VVar12.level = (this->trail_lim).sz;
                VVar12.reason = local_70.cref;
                (this->vardata).data[iVar9] = VVar12;
                iVar9 = (this->trail).sz;
                (this->trail).sz = iVar9 + 1;
                (this->trail).data[iVar9].x = local_70.blocker.x;
              }
            }
            else {
              if (iVar26 < 3) goto LAB_0010bc10;
              local_64 = this->nbVarsInitialFormula;
              uVar14 = 0xffffffff;
              uVar19 = 2;
              do {
                iVar26 = (int)puVar5[(ulong)local_70.cref + uVar19 + 3] >> 1;
                bVar7 = (byte)puVar5[(ulong)local_70.cref + uVar19 + 3] & 1;
                pWVar11 = local_58;
                if ((bVar7 ^ plVar4[iVar26].value) != 1) {
                  if ((((this->assumptions).sz < (this->trail_lim).sz) ||
                      (plVar4[iVar26].value == bVar7)) || (iVar26 <= local_64)) {
                    iVar26 = (int)uVar19;
                    goto LAB_0010bcc7;
                  }
                  uVar14 = uVar19 & 0xffffffff;
                }
                iVar26 = (int)uVar14;
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
              this = local_60;
              if (iVar26 == -1) goto LAB_0010bc10;
LAB_0010bcc7:
              *(undefined4 *)(puVar1 + 2) = *(undefined4 *)((long)puVar1 + (long)iVar26 * 4 + 0xc);
              *(uint *)((long)puVar1 + (long)iVar26 * 4 + 0xc) = uVar13;
              uVar3 = (uint)puVar1[2];
              this = local_60;
LAB_0010bcf7:
              vec<Glucose::Solver::Watcher>::push
                        ((local_50->occs).data + ((long)(int)uVar3 ^ 1),&local_70);
            }
          }
          pWVar22 = pWVar23;
        } while (pWVar23 != pWVar11);
        p.x = (int)local_40;
        pvVar25 = local_48;
        uVar17 = local_38;
      }
      iVar9 = (int)((ulong)((long)pWVar11 - (long)pWVar24) >> 3);
      if (0 < iVar9) {
        pvVar25->sz = pvVar25->sz - iVar9;
      }
      if ((this->useUnaryWatched == true) && (local_7c == 0xffffffff)) {
        local_7c = propagateUnaryWatches(this,p);
      }
      uVar13 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar13;
      iVar9 = this->qhead;
    } while (iVar9 < (this->trail).sz);
    uVar17 = (ulong)uVar13;
  }
  else {
    local_7c = 0xffffffff;
  }
  this->propagations = this->propagations + uVar17;
  this->simpDB_props = this->simpDB_props - uVar17;
  return local_7c;
}

Assistant:

CRef Solver::propagate() {
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    while(qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec <Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec <Watcher> &wbin = watchesBin[p];
        for(int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if(value(imp) == l_False) {
                return wbin[k].cref;
            }

            if(value(imp) == l_Undef) {
                uncheckedEnqueue(imp, wbin[k].cref);
            }
        }

        // Now propagate other 2-watched clauses
        for(i = j = (Watcher *) ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if(value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            assert(!c.getOneWatched());
            Lit false_lit = ~p;
            if(c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            Watcher w = Watcher(cr, first);
            if(first != blocker && value(first) == l_True) {

                *j++ = w;
                continue;
            }
#ifdef INCREMENTAL
            if(incremental) { // ----------------- INCREMENTAL MODE
              int choosenPos = -1;
              for (int k = 2; k < c.size(); k++) {

            if (value(c[k]) != l_False){
              if(decisionLevel()>assumptions.size()) {
                choosenPos = k;
                break;
              } else {
                choosenPos = k;

                if(value(c[k])==l_True || !isSelector(var(c[k]))) {
                  break;
                }
              }

            }
              }
              if(choosenPos!=-1) {
            c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            watches[~c[1]].push(w);
            goto NextClause; }
            } else {  // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
#endif
            for(int k = 2; k < c.size(); k++) {

                if(value(c[k]) != l_False) {
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                }
            }
#ifdef INCREMENTAL
            }
#endif
            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if(value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while(i < end)
                    *j++ = *i++;
            } else {
                uncheckedEnqueue(first, cr);


            }
            NextClause:;
        }
        ws.shrink(i - j);

        // unaryWatches "propagation"
        if(useUnaryWatched && confl == CRef_Undef) {
            confl = propagateUnaryWatches(p);

        }

    }


    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}